

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

void __thiscall cxx::ModelGrammar::ModelGrammar(ModelGrammar *this)

{
  karma_rule<ast::Model_()> *this_00;
  string *this_01;
  undefined8 uVar1;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
  eVar2;
  _Alloc_hider _Var3;
  undefined8 uVar4;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
  eVar5;
  karma_rule<fidler::ast::ConstantDef_()> *this_02;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>
  that_1;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>
  that;
  TypeDefinitionGrammar **local_130;
  InitializerGrammar *local_128;
  string local_120;
  _Alloc_hider local_100;
  karma_rule<fidler::ast::Broadcast_()> **local_f8;
  proto_child0 local_f0;
  TypeDefinitionGrammar *local_e8;
  proto_child0 local_e0;
  _Alloc_hider *local_d8;
  undefined1 local_d0 [32];
  proto_child0 local_b0;
  proto_child0 local_a8;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::grammar<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_a0;
  _Alloc_hider local_98;
  code *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
  local_78;
  _Alloc_hider local_70;
  InitializerGrammar *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
  local_50;
  function_buffer local_48;
  
  std::__cxx11::string::string((string *)&local_120,"unnamed-grammar",(allocator *)&local_130);
  this_00 = &this->model_;
  (this->super_karma_grammar<ast::Model_()>).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::grammar<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = this_00;
  this_01 = &(this->super_karma_grammar<ast::Model_()>).name_;
  std::__cxx11::string::string((string *)this_01,(string *)&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  local_48._8_8_ = this_01;
  std::__cxx11::string::string((string *)&local_120,"unnamed-rule",(allocator *)&local_130);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(this_00,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  local_60._8_8_ = &this->type_;
  local_48.members._0_8_ = (undefined8)this_00;
  TypeGrammar::TypeGrammar((TypeGrammar *)local_60._8_8_);
  local_50.child0.ref.t_ = (proto_child0)&this->type_definition_;
  TypeDefinitionGrammar::TypeDefinitionGrammar((TypeDefinitionGrammar *)local_50.child0.ref.t_);
  InitializerGrammar::InitializerGrammar(&this->initializer_);
  local_68 = &this->initializer_;
  std::__cxx11::string::string((string *)&local_120,"unnamed-rule",(allocator *)&local_130);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->type_collection_,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  local_60._M_allocated_capacity = (size_type)&this->type_collection_;
  std::__cxx11::string::string((string *)&local_120,"unnamed-rule",(allocator *)&local_130);
  local_88._M_allocated_capacity = (size_type)&this->interface_;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Interface_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule((rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Interface_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_88._M_allocated_capacity,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_120,"unnamed-rule",(allocator *)&local_130);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Method_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->method_,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  local_70._M_p = (pointer)&this->method_;
  std::__cxx11::string::string((string *)&local_120,"unnamed-rule",(allocator *)&local_130);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Broadcast_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->broadcast_,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  local_78.child0.ref.t_ = (proto_child0)(proto_child0)&this->broadcast_;
  std::__cxx11::string::string((string *)&local_120,"unnamed-rule",(allocator *)&local_130);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->argument_,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  local_88._8_8_ = &this->argument_;
  std::__cxx11::string::string((string *)&local_120,"unnamed-rule",(allocator *)&local_130);
  this_02 = &this->constant_def_;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ConstantDef_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(this_02,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  uVar1 = local_60._0_8_;
  local_d0._0_8_ = "package: \'";
  local_d0._8_8_ = &boost::spirit::standard::string;
  local_130 = (TypeDefinitionGrammar **)&local_e0;
  local_d8 = (_Alloc_hider *)0x61a77f;
  local_128 = (InitializerGrammar *)&local_f0;
  local_f0.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_60._0_8_;
  local_120._M_string_length = (size_type)&local_100;
  local_100._M_p = (pointer)local_88._0_8_;
  local_120._M_dataplus._M_p = (pointer)&local_130;
  local_e0.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_d0;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Model(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[11]>,0l>,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[3]>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::TypeCollection(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Interface(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,1l>const&>,2l>>
            (this_00,&local_120);
  eVar5.child0.ref.t_ = local_50.child0.ref.t_;
  local_100._M_p = &boost::spirit::standard::string;
  local_f8 = (karma_rule<fidler::ast::Broadcast_()> **)fidler::snake_case;
  local_f0.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)0x61a787;
  local_e8 = (TypeDefinitionGrammar *)&local_100;
  local_d0._0_8_ = &local_f0;
  local_d0._8_8_ = "\n{\n";
  local_d8 = (_Alloc_hider *)&local_a8;
  local_a8.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_50.child0.ref.t_;
  local_128 = (InitializerGrammar *)&local_b0;
  local_130 = (TypeDefinitionGrammar **)&local_e0;
  local_98._M_p = "} // namespace ";
  local_90 = (code *)&boost::spirit::standard::string;
  local_48._16_8_ = (long)local_d0 + 0x10;
  local_d0._24_8_ = "\n\n";
  local_120._M_dataplus._M_p = (pointer)&local_130;
  local_120._M_string_length = (size_type)((long)&local_48 + 0x10U);
  local_e0.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_a0;
  local_d0._16_8_ = &local_98;
  local_b0.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )this_02;
  local_a0.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )(expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )local_d0;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::TypeCollection(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[11]>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::p___:tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[3]>,0l>>,2l>const&>,1l>const&>,2l>>
            (uVar1);
  _Var3._M_p = local_70._M_p;
  eVar2.child0.ref.t_ = local_78.child0.ref.t_;
  local_98._M_p = &boost::spirit::standard::string;
  local_90 = fidler::pascal_case;
  local_d0._16_8_ = "class ";
  local_100._M_p = (pointer)((long)local_d0 + 0x10);
  local_f8 = (karma_rule<fidler::ast::Broadcast_()> **)0x610ce7;
  local_130 = (TypeDefinitionGrammar **)&local_e0;
  local_120._M_dataplus._M_p = (pointer)&local_130;
  local_120._M_string_length = 0x61a792;
  local_a0.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )(expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )eVar5.child0.ref.t_;
  local_f0.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_100;
  local_a8.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_70._M_p;
  local_d0._0_8_ = &local_f0;
  local_d0._8_8_ = &local_a8;
  local_b0.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_78.child0.ref.t_;
  local_e0.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )local_d0;
  local_d8 = (_Alloc_hider *)&local_b0;
  local_128 = (InitializerGrammar *)((long)&local_48 + 0x10U);
  local_e8 = (TypeDefinitionGrammar *)&local_a0;
  local_d0._24_8_ = &local_98;
  local_48._16_8_ = this_02;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Interface(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[7]>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_e___s_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[4]>,0l>>,2l>>
            (local_88._0_8_);
  uVar1 = local_88._8_8_;
  local_f0.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&boost::spirit::standard::string;
  local_e8 = (TypeDefinitionGrammar *)fidler::snake_case;
  local_d0._0_8_ = "  void ";
  local_d0._8_8_ = &local_f0;
  local_98._M_p._0_1_ = 0x28;
  local_e0.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )local_d0;
  local_100._M_p = (pointer)local_88._8_8_;
  local_f8 = (karma_rule<fidler::ast::Broadcast_()> **)0x610d0a;
  local_d0._16_8_ = &local_100;
  local_130 = (TypeDefinitionGrammar **)&local_e0;
  local_128 = (InitializerGrammar *)((long)local_d0 + 0x10);
  local_120._M_dataplus._M_p = (pointer)&local_130;
  local_120._M_string_length = 0x61a7ce;
  local_d8 = &local_98;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Method(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[8]>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<void(&)(std::__cxx11::string&)>,0l>>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,boost::proto::argsns_::list2<boost::spirit::karma::rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Argument(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[3]>,0l>>,2l>const&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[5]>,0l>>,2l>>
            (_Var3._M_p);
  local_f0.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&boost::spirit::standard::string;
  local_e8 = (TypeDefinitionGrammar *)fidler::snake_case;
  local_d0._0_8_ = "  connection on_";
  local_d0._8_8_ = &local_f0;
  local_e0.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )local_d0;
  local_d8 = (_Alloc_hider *)0x61a7af;
  local_100._M_p = (pointer)uVar1;
  local_f8 = (karma_rule<fidler::ast::Broadcast_()> **)0x610d0a;
  local_d0._16_8_ = &local_100;
  local_130 = (TypeDefinitionGrammar **)&local_e0;
  local_128 = (InitializerGrammar *)((long)local_d0 + 0x10);
  local_120._M_dataplus._M_p = (pointer)&local_130;
  local_120._M_string_length = 0x61a7c4;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Broadcast(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[17]>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<void(&)(std::__cxx11::string&)>,0l>>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[21]>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,boost::proto::argsns_::list2<boost::spirit::karma::rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Argument(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[3]>,0l>>,2l>const&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[15]>,0l>>,2l>>
            (eVar2.child0.ref.t_);
  uVar4 = local_60._8_8_;
  local_a0.proto_expr_.child0.ref.t_._0_1_ = 1;
  local_d0._16_8_ = &local_a0;
  local_f0.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )((long)local_d0 + 0x10);
  local_e8 = (TypeDefinitionGrammar *)0x61ba2e;
  local_d0._0_8_ = &local_f0;
  local_d0._8_8_ = local_60._8_8_;
  local_a8.ref.t_._0_1_ = 1;
  local_b0.ref.t_._0_1_ = 0x3e;
  local_100._M_p = (pointer)&local_98;
  local_e0.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )local_d0;
  local_d8 = &local_100;
  local_130 = (TypeDefinitionGrammar **)&local_e0;
  local_128 = (InitializerGrammar *)0x61a7d3;
  local_120._M_string_length = (size_type)&boost::spirit::standard::string;
  local_120._M_dataplus._M_p = (pointer)&local_130;
  local_f8 = (karma_rule<fidler::ast::Broadcast_()> **)&local_b0;
  local_98._M_p = (pointer)&local_a8;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Argument(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,boost::fusion::vector<bool>>>,0l>const&>,1l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[13]>,0l>>,2l>const&,cxx::TypeGrammar&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,boost::fusion::vector<bool>>>,0l>const&>,1l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[9]>,0l>>,2l>const&,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>>
            (uVar1);
  local_d0._16_8_ = "const ";
  local_d0._24_8_ = uVar4;
  local_a8.ref.t_._0_1_ = 1;
  local_98._M_p = (pointer)&local_a0;
  local_90 = (code *)0x610d35;
  local_100._M_p = (pointer)((long)local_d0 + 0x10);
  local_f8 = (karma_rule<fidler::ast::Broadcast_()> **)&local_98;
  local_b0.ref.t_._0_1_ = 0x20;
  local_f0.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_100;
  local_d0._0_8_ = &local_f0;
  local_d0._8_8_ = &boost::spirit::standard::string;
  local_e0.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )local_d0;
  local_d8 = (_Alloc_hider *)0x610d85;
  local_130 = (TypeDefinitionGrammar **)&local_e0;
  local_128 = local_68;
  local_120._M_string_length = 0x61a793;
  local_120._M_dataplus._M_p = (pointer)&local_130;
  local_e8 = (TypeDefinitionGrammar *)&local_b0;
  local_a0.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )(expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )&local_a8;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::ConstantDef(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[7]>,0l>,cxx::TypeGrammar&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,boost::fusion::vector<bool>>>,0l>const&>,1l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[3]>,0l>>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[4]>,0l>>,2l>const&,cxx::InitializerGrammar&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[3]>,0l>>,2l>>
            (this_02);
  return;
}

Assistant:

ModelGrammar::ModelGrammar() :
		ModelGrammar::base_type(model_)
{
	namespace karma = boost::spirit::karma;

	model_
		%= "package: '"
		<< karma::string
		<< "'\n"
		<< *type_collection_
		<< *interface_
		;

	type_collection_
		%= -("namespace " << karma::string[fidler::snake_case] << "\n{\n")
		<< *type_definition_
		<< *constant_def_
		<< -("} // namespace " << karma::string << "\n\n")
		;

	interface_
		%= "class "
		<< karma::string[fidler::pascal_case]
		<< "\n{\n"
		<< *type_definition_
		<< *method_
		<< *broadcast_
		<< *constant_def_
		<< "};\n"
		;

	method_
		%= "  void "
		<< karma::string[fidler::snake_case]
		<< '('
		<< -(argument_ % ", ")
		<< ");\n\n"
		;

	broadcast_
		%= "  connection on_"
		<< karma::string[fidler::snake_case]
		<< "(std::function<void("
		<< -(argument_ % ", ")
		<< ")> handler);\n\n"
		;

	argument_
		%= (!karma::bool_(true) | "std::vector<")
		<< type_
		<< (!karma::bool_(true) | '>')
		<< " const& "
		<< karma::string
		;

	constant_def_
		%= "const "
		<< type_
		<< (!karma::bool_(true) | "[]")
		<< ' '
		<< karma::string
		<< " = "
		<< initializer_
		<< ";\n"
		;
}